

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_ratio(REF_CAVITY ref_cavity,REF_BOOL *allowed)

{
  REF_DBL *pRVar1;
  int node0;
  REF_GRID pRVar2;
  REF_NODE ref_node;
  REF_ADAPT pRVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  REF_DBL ratio;
  
  pRVar2 = ref_cavity->ref_grid;
  ref_node = pRVar2->node;
  node0 = ref_cavity->node;
  *allowed = 1;
  lVar8 = 0;
  lVar7 = 0;
  do {
    if (ref_cavity->maxface <= lVar7) {
      return 0;
    }
    if (ref_cavity->f2n[lVar7 * 3] != -1) {
      bVar4 = false;
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        if (node0 == *(int *)((long)ref_cavity->f2n + lVar6 * 4 + lVar8)) {
          bVar4 = true;
        }
      }
      if (!bVar4) {
        lVar6 = 0;
        while (lVar6 != 3) {
          uVar5 = ref_node_ratio(ref_node,node0,
                                 *(REF_INT *)((long)ref_cavity->f2n + lVar6 * 4 + lVar8),&ratio);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x920,"ref_cavity_ratio",(ulong)uVar5,"ratio");
            return uVar5;
          }
          pRVar3 = pRVar2->adapt;
          if ((ratio < pRVar3->post_min_ratio) ||
             (lVar6 = lVar6 + 1, pRVar1 = &pRVar3->post_max_ratio,
             *pRVar1 <= ratio && ratio != *pRVar1)) {
            *allowed = 0;
            return 0;
          }
        }
      }
    }
    lVar7 = lVar7 + 1;
    lVar8 = lVar8 + 0xc;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cavity_ratio(REF_CAVITY ref_cavity, REF_BOOL *allowed) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_DBL ratio;
  REF_INT face, face_node;
  REF_BOOL skip;

  *allowed = REF_TRUE;

  each_ref_cavity_valid_face(ref_cavity, face) {
    skip = REF_FALSE;
    /* skip a collapsed triangle that in on the boundary of cavity */
    each_ref_cavity_face_node(ref_cavity, face_node) {
      if (node == ref_cavity_f2n(ref_cavity, face_node, face)) {
        skip = REF_TRUE;
      }
    }
    if (skip) continue;
    each_ref_cavity_face_node(ref_cavity, face_node) {
      RSS(ref_node_ratio(ref_node, node,
                         ref_cavity_f2n(ref_cavity, face_node, face), &ratio),
          "ratio");
      if (ratio < ref_grid_adapt(ref_grid, post_min_ratio) ||
          ratio > ref_grid_adapt(ref_grid, post_max_ratio)) {
        *allowed = REF_FALSE;
        return REF_SUCCESS;
      }
    }
  }

  return REF_SUCCESS;
}